

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COSOperator.cpp
# Opt level: O2

void __thiscall irr::COSOperator::COSOperator(COSOperator *this,void **vtt,stringc *osVersion)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IOSOperator)._vptr_IOSOperator = pp_Var1;
  *(void **)((long)&(this->super_IOSOperator)._vptr_IOSOperator + (long)pp_Var1[-3]) = vtt[2];
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IOSOperator)._vptr_IOSOperator = pp_Var1;
  *(void **)((long)&(this->super_IOSOperator)._vptr_IOSOperator + (long)pp_Var1[-3]) = vtt[3];
  core::string<char>::string((string<char> *)&(this->super_IOSOperator).field_0x8,osVersion);
  this->ClipboardSelectionText = (char *)0x0;
  this->PrimarySelectionText = (char *)0x0;
  return;
}

Assistant:

COSOperator::COSOperator(const core::stringc &osVersion) :
		OperatingSystem(osVersion)
{
#ifdef _DEBUG
	setDebugName("COSOperator");
#endif
}